

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O2

void divsufsortxx::substring::
     merge<std::stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>>,char*,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
               (stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                *stack,char *T,iterator PA,iterator first,iterator middle,iterator last,iterator buf
               ,value_type bufsize,value_type depth)

{
  iterator first2;
  iterator first_00;
  iterator first_01;
  iterator middle_00;
  iterator middle_01;
  iterator last_00;
  iterator last_01;
  BitmapArray<long> *pBVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int extraout_var;
  undefined4 extraout_var_00;
  int extraout_var_01;
  undefined4 extraout_var_02;
  int extraout_var_03;
  int extraout_var_04;
  undefined4 extraout_var_05;
  int extraout_var_06;
  int extraout_var_07;
  int extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  int extraout_var_12;
  int extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  int extraout_var_16;
  int extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  int extraout_var_21;
  int extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  int extraout_var_26;
  int extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  _Elt_pointer psVar6;
  pos_type pVar7;
  BitmapArray<long> *pBVar8;
  long lVar9;
  BitmapArray<long> *pBVar10;
  uint uVar11;
  long lVar12;
  BitmapArray<long> *pBVar13;
  ulong uVar14;
  ulong uVar15;
  iterator p1;
  iterator first1;
  iterator p1_00;
  iterator p1_01;
  iterator p1_02;
  iterator p1_03;
  iterator p2;
  iterator last1;
  iterator p2_00;
  iterator p2_01;
  iterator p2_02;
  iterator p2_03;
  BitmapArray<long> *in_stack_fffffffffffffed8;
  ulong in_stack_fffffffffffffee0;
  BitmapArray<long> *local_f8;
  BitmapArray<long> *local_c8;
  ulong local_a0;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
  local_98;
  ulong local_60;
  BitmapArray<long> *local_58;
  BitmapArray<long> *local_50;
  ulong uStack_48;
  BitmapArray<long> *local_40;
  ulong uStack_38;
  
  uVar14 = first.pos_;
  local_f8 = first.array_;
  pVar7 = PA.pos_;
  pBVar8 = PA.array_;
  local_c8 = (BitmapArray<long> *)last.pos_;
  uVar11 = 0;
  do {
    while (uVar5 = (long)local_c8 - middle.pos_, (long)uVar5 <= bufsize) {
      if ((uVar14 < middle.pos_) && (middle.pos_ < local_c8)) {
        local_40 = local_f8;
        first_00.pos_ = uVar14;
        first_00.array_ = local_f8;
        middle_00.pos_ = middle.pos_;
        middle_00.array_ = middle.array_;
        last_00.pos_ = (pos_type)local_c8;
        last_00.array_ = last.array_;
        in_stack_fffffffffffffed8 = local_f8;
        in_stack_fffffffffffffee0 = uVar14;
        uStack_38 = uVar14;
        merge_backward<char*,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                  (T,PA,buf,first_00,middle_00,last_00,depth);
      }
LAB_001093f0:
      if (((uVar11 & 1) != 0) &&
         ((*(local_f8->super_Bitmap)._vptr_Bitmap[5])(local_f8,uVar14), -1 < extraout_var_07)) {
        (*(local_f8->super_Bitmap)._vptr_Bitmap[5])(local_f8,uVar14 - 1);
        iVar2 = (*(local_f8->super_Bitmap)._vptr_Bitmap[5])(local_f8,uVar14 - 1);
        iVar3 = (*(local_f8->super_Bitmap)._vptr_Bitmap[5])(local_f8,uVar14);
        p1_00.pos_ = ((long)extraout_var_08 >> 0x1f ^ CONCAT44(extraout_var_09,iVar2)) + pVar7;
        p1_00.array_ = pBVar8;
        p2_00.pos_ = CONCAT44(extraout_var_10,iVar3) + pVar7;
        p2_00.array_ = pBVar8;
        iVar2 = compare<char*,bitmap::BitmapArray<long>::iterator>(T,p1_00,p2_00,depth);
        if (iVar2 == 0) {
          iVar2 = (*(local_f8->super_Bitmap)._vptr_Bitmap[5])(local_f8,uVar14);
          (*(local_f8->super_Bitmap)._vptr_Bitmap[4])
                    (local_f8,uVar14,~CONCAT44(extraout_var_11,iVar2));
        }
      }
      if (((uVar11 & 2) != 0) &&
         ((*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,local_c8),
         -1 < extraout_var_12)) {
        (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,&local_c8[-1].field_0x27);
        iVar2 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])
                          (last.array_,&local_c8[-1].field_0x27);
        uVar14 = (long)extraout_var_13 >> 0x1f ^ CONCAT44(extraout_var_14,iVar2);
        iVar2 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,local_c8);
        lVar12 = CONCAT44(extraout_var_15,iVar2);
LAB_00109719:
        p2_03.pos_ = lVar12 + pVar7;
        p1_03.pos_ = uVar14 + pVar7;
        p1_03.array_ = pBVar8;
        p2_03.array_ = pBVar8;
        iVar2 = compare<char*,bitmap::BitmapArray<long>::iterator>(T,p1_03,p2_03,depth);
        if (iVar2 == 0) {
          iVar2 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,local_c8);
          (*((last.array_)->super_Bitmap)._vptr_Bitmap[4])
                    (last.array_,local_c8,~CONCAT44(extraout_var_30,iVar2));
        }
      }
LAB_00109748:
      psVar6 = (stack->c).
               super__Deque_base<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (psVar6 == (stack->c).
                    super__Deque_base<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        return;
      }
      if (psVar6 == (stack->c).
                    super__Deque_base<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        psVar6 = (stack->c).
                 super__Deque_base<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 9;
      }
      local_f8 = psVar6[-1].m_a.array_;
      uVar14 = psVar6[-1].m_a.pos_;
      middle.array_ = psVar6[-1].m_b.array_;
      middle.pos_ = psVar6[-1].m_b.pos_;
      last.array_ = psVar6[-1].m_c.array_;
      local_c8 = (BitmapArray<long> *)psVar6[-1].m_c.pos_;
      uVar11 = psVar6[-1].m_d;
      std::
      deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
      ::pop_back(&stack->c);
    }
    local_a0 = middle.pos_ - uVar14;
    if ((long)local_a0 <= bufsize) {
      if (uVar14 < middle.pos_) {
        local_50 = local_f8;
        first_01.pos_ = uVar14;
        first_01.array_ = local_f8;
        middle_01.pos_ = middle.pos_;
        middle_01.array_ = middle.array_;
        last_01.pos_ = (pos_type)local_c8;
        last_01.array_ = last.array_;
        in_stack_fffffffffffffed8 = local_f8;
        in_stack_fffffffffffffee0 = uVar14;
        uStack_48 = uVar14;
        merge_forward<char*,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                  (T,PA,buf,first_01,middle_01,last_01,depth);
      }
      goto LAB_001093f0;
    }
    uVar15 = local_a0;
    if ((long)uVar5 < (long)local_a0) {
      uVar15 = uVar5;
    }
    lVar12 = 0;
    local_58 = middle.array_;
    local_60 = uVar5;
    while (pBVar1 = local_58, 0 < (long)uVar15) {
      uVar5 = uVar15 >> 1;
      lVar9 = uVar5 + lVar12 + middle.pos_;
      (*(local_58->super_Bitmap)._vptr_Bitmap[5])(local_58,lVar9);
      iVar2 = (*(pBVar1->super_Bitmap)._vptr_Bitmap[5])(pBVar1,lVar9);
      lVar9 = ~(uVar5 + lVar12) + middle.pos_;
      (*(pBVar1->super_Bitmap)._vptr_Bitmap[5])(pBVar1,lVar9);
      iVar3 = (*(pBVar1->super_Bitmap)._vptr_Bitmap[5])(pBVar1,lVar9);
      p1.pos_ = ((long)extraout_var >> 0x1f ^ CONCAT44(extraout_var_00,iVar2)) + pVar7;
      p1.array_ = pBVar8;
      p2.pos_ = ((long)extraout_var_01 >> 0x1f ^ CONCAT44(extraout_var_02,iVar3)) + pVar7;
      p2.array_ = pBVar8;
      iVar2 = compare<char*,bitmap::BitmapArray<long>::iterator>(T,p1,p2,depth);
      if (iVar2 < 0) {
        uVar4 = ~(uint)uVar15 & 1;
        lVar12 = lVar12 + uVar5 + 1;
      }
      else {
        uVar4 = 0;
      }
      uVar15 = uVar5 - uVar4;
    }
    if (lVar12 < 1) {
      if (((uVar11 & 1) != 0) &&
         ((*(local_f8->super_Bitmap)._vptr_Bitmap[5])(local_f8,uVar14), -1 < extraout_var_16)) {
        (*(local_f8->super_Bitmap)._vptr_Bitmap[5])(local_f8,uVar14 - 1);
        iVar2 = (*(local_f8->super_Bitmap)._vptr_Bitmap[5])(local_f8,uVar14 - 1);
        iVar3 = (*(local_f8->super_Bitmap)._vptr_Bitmap[5])(local_f8,uVar14);
        p1_01.pos_ = ((long)extraout_var_17 >> 0x1f ^ CONCAT44(extraout_var_18,iVar2)) + pVar7;
        p1_01.array_ = pBVar8;
        p2_01.pos_ = CONCAT44(extraout_var_19,iVar3) + pVar7;
        p2_01.array_ = pBVar8;
        iVar2 = compare<char*,bitmap::BitmapArray<long>::iterator>(T,p1_01,p2_01,depth);
        if (iVar2 == 0) {
          iVar2 = (*(local_f8->super_Bitmap)._vptr_Bitmap[5])(local_f8,uVar14);
          (*(local_f8->super_Bitmap)._vptr_Bitmap[4])
                    (local_f8,uVar14,~CONCAT44(extraout_var_20,iVar2));
        }
      }
      (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,middle.pos_);
      if (-1 < extraout_var_21) {
        (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,middle.pos_ - 1);
        iVar2 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,middle.pos_ - 1);
        iVar3 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,middle.pos_);
        p1_02.pos_ = ((long)extraout_var_22 >> 0x1f ^ CONCAT44(extraout_var_23,iVar2)) + pVar7;
        p1_02.array_ = pBVar8;
        p2_02.pos_ = CONCAT44(extraout_var_24,iVar3) + pVar7;
        p2_02.array_ = pBVar8;
        iVar2 = compare<char*,bitmap::BitmapArray<long>::iterator>(T,p1_02,p2_02,depth);
        if (iVar2 == 0) {
          iVar2 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,middle.pos_);
          (*((middle.array_)->super_Bitmap)._vptr_Bitmap[4])
                    (middle.array_,middle.pos_,~CONCAT44(extraout_var_25,iVar2));
        }
      }
      if (((uVar11 & 2) != 0) &&
         ((*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,local_c8),
         -1 < extraout_var_26)) {
        (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,&local_c8[-1].field_0x27);
        iVar2 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])
                          (last.array_,&local_c8[-1].field_0x27);
        uVar14 = (long)extraout_var_27 >> 0x1f ^ CONCAT44(extraout_var_28,iVar2);
        iVar2 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,local_c8);
        lVar12 = CONCAT44(extraout_var_29,iVar2);
        goto LAB_00109719;
      }
      goto LAB_00109748;
    }
    first1.array_ = (BitmapArray<long> *)(middle.pos_ - lVar12);
    first2.pos_ = in_stack_fffffffffffffee0;
    first2.array_ = in_stack_fffffffffffffed8;
    first1.pos_ = (pos_type)local_58;
    last1.pos_ = (pos_type)local_58;
    last1.array_ = (BitmapArray<long> *)middle.pos_;
    helper::vecswap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
              ((helper *)local_58,first1,last1,first2);
    pBVar13 = (BitmapArray<long> *)(lVar12 + middle.pos_);
    uVar4 = 0;
    uVar15 = local_60;
    pBVar10 = (BitmapArray<long> *)middle.pos_;
    uVar5 = middle.pos_;
    if (pBVar13 < local_c8) {
      (*(pBVar1->super_Bitmap)._vptr_Bitmap[5])(pBVar1,pBVar13);
      if (extraout_var_03 < 0) {
        pBVar10 = (BitmapArray<long> *)(middle.pos_ + 1);
        do {
          (*(pBVar1->super_Bitmap)._vptr_Bitmap[5])(pBVar1,(long)pBVar10 + -2);
          pBVar10 = (BitmapArray<long> *)((long)pBVar10 + -1);
        } while (extraout_var_04 < 0);
        iVar2 = (*(pBVar1->super_Bitmap)._vptr_Bitmap[5])(pBVar1,pBVar13);
        (*(pBVar1->super_Bitmap)._vptr_Bitmap[4])(pBVar1,pBVar13,~CONCAT44(extraout_var_05,iVar2));
      }
      uVar5 = middle.pos_ - 1;
      do {
        uVar5 = uVar5 + 1;
        (*(pBVar1->super_Bitmap)._vptr_Bitmap[5])(pBVar1,uVar5);
      } while (extraout_var_06 < 0);
      local_a0 = (long)pBVar10 - uVar14;
      uVar15 = (long)local_c8 - uVar5;
      uVar4 = 1;
    }
    local_98.m_b.array_ = pBVar1;
    if ((long)uVar15 < (long)local_a0) {
      uVar4 = uVar4 << ((BitmapArray<long> *)middle.pos_ == pBVar10 && uVar5 == middle.pos_);
      local_98.m_d = uVar4 & 0xfffffffe | uVar11 & 1;
      local_98.m_a.array_ = local_f8;
      local_98.m_a.pos_ = uVar14;
      local_98.m_b.pos_ = (pos_type)first1.array_;
      local_98.m_c.array_ = pBVar1;
      local_98.m_c.pos_ = (pos_type)pBVar10;
      std::
      deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
      ::
      emplace_back<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                  *)stack,&local_98);
      uVar11 = uVar11 & 2 | uVar4 & 1;
      uVar14 = uVar5;
      middle.pos_ = (pos_type)pBVar13;
      local_f8 = pBVar1;
    }
    else {
      local_98.m_c.array_ = last.array_;
      local_98.m_c.pos_ = (pos_type)local_c8;
      local_98.m_d = uVar4 | uVar11 & 2;
      local_98.m_a.array_ = pBVar1;
      local_98.m_a.pos_ = uVar5;
      local_98.m_b.pos_ = (pos_type)pBVar13;
      std::
      deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
      ::
      emplace_back<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                  *)stack,&local_98);
      uVar11 = uVar11 & 1;
      middle.pos_ = (pos_type)first1.array_;
      local_c8 = pBVar10;
      last.array_ = pBVar1;
    }
  } while( true );
}

Assistant:

void merge(stack_type &stack, const StringIterator_type T,
           const SAIterator_type PA, SAIterator_type first,
           SAIterator_type middle, SAIterator_type last, BufIterator_type buf,
           typename std::iterator_traits<SAIterator_type>::value_type bufsize,
           typename std::iterator_traits<SAIterator_type>::value_type depth) {
  typedef typename std::iterator_traits<SAIterator_type>::difference_type difference_type;
  typedef typename stack_type::value_type stackinfo_type;
#define GETIDX(a) ((0 <= (a)) ? (a) : (~(a)))
#define MERGE_CHECK(a)\
  {\
    if((0 <= *(a)) &&\
       (compare(T, PA + GETIDX(*((a) - 1)), PA + *(a), depth) == 0)) {\
      *(a) = ~*(a);\
    }\
  }

  SAIterator_type i, j;
  difference_type m, len, half;
  int check, next;

  for (check = 0;;) {

    if ((last - middle) <= bufsize) {
      if ((first < middle) && (middle < last)) {
        merge_backward(T, PA, buf, first, middle, last, depth);
      }
      if (check & 1) {
        MERGE_CHECK(first);
      }
      if (check & 2) {
        MERGE_CHECK(last);
      }
      STACK_POP4(first, middle, last, check);
      continue;
    }

    if ((middle - first) <= bufsize) {
      if (first < middle) {
        merge_forward(T, PA, buf, first, middle, last, depth);
      }
      if (check & 1) {
        MERGE_CHECK(first);
      }
      if (check & 2) {
        MERGE_CHECK(last);
      }
      STACK_POP4(first, middle, last, check);
      continue;
    }

    for (m = 0, len = std::min(middle - first, last - middle), half = len >> 1;
        0 < len; len = half, half >>= 1) {
      if (compare(T, PA + GETIDX(*(middle + m + half)),
                  PA + GETIDX(*(middle - m - half - 1)), depth) < 0) {
        m += half + 1;
        half -= ((len & 1) == 0);
      }
    }

    if (0 < m) {
      helper::vecswap(middle - m, middle, middle);
      i = j = middle, next = 0;
      if ((middle + m) < last) {
        if (*(middle + m) < 0) {
          for (; *(i - 1) < 0; --i) {
          }
          *(middle + m) = ~*(middle + m);
        }
        for (j = middle; *j < 0; ++j) {
        }
        next = 1;
      }
      if ((i - first) <= (last - j)) {
        STACK_PUSH4(j, middle + m, last, (check & 2) | (next & 1));
        middle -= m, last = i, check = (check & 1);
      } else {
        if ((i == middle) && (middle == j)) {
          next <<= 1;
        }
        STACK_PUSH4(first, middle - m, i, (check & 1) | (next & 2));
        first = j, middle += m, check = (check & 2) | (next & 1);
      }
    } else {
      if (check & 1) {
        MERGE_CHECK(first);
      }
      MERGE_CHECK(middle);
      if (check & 2) {
        MERGE_CHECK(last);
      }
      STACK_POP4(first, middle, last, check);
    }
  }
#undef GETIDX
#undef MERGE_CHECK
}